

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disflow.c
# Opt level: O2

double bicubic_interp_one(double *arr,int stride,double *h_kernel,double *v_kernel)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  long lVar5;
  double *pdVar6;
  double tmp [4];
  
  dVar1 = *h_kernel;
  dVar2 = h_kernel[1];
  dVar3 = h_kernel[2];
  dVar4 = h_kernel[3];
  pdVar6 = arr + -(long)stride;
  for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
    tmp[lVar5] = pdVar6[2] * dVar4 + pdVar6[1] * dVar3 + pdVar6[-1] * dVar1 + *pdVar6 * dVar2;
    pdVar6 = pdVar6 + stride;
  }
  return v_kernel[3] * tmp[3] + v_kernel[2] * tmp[2] + *v_kernel * tmp[0] + v_kernel[1] * tmp[1];
}

Assistant:

static inline double bicubic_interp_one(const double *arr, int stride,
                                        const double h_kernel[4],
                                        const double v_kernel[4]) {
  double tmp[1 * 4];

  // Horizontal convolution
  for (int i = -1; i < 3; ++i) {
    tmp[i + 1] = get_cubic_value_dbl(&arr[i * stride - 1], h_kernel);
  }

  // Vertical convolution
  return get_cubic_value_dbl(tmp, v_kernel);
}